

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>
::_reduce_column_by(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>
                    *this,Index target,Index source)

{
  Column *targetColumn;
  Column *source_00;
  Column *this_00;
  Column *pCVar1;
  
  targetColumn = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>
                 ::get_column(&this->reducedMatrixR_,target);
  source_00 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>
              ::get_column(&this->reducedMatrixR_,source);
  _add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,false,true>>>>
            (source_00,targetColumn);
  this_00 = Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>
            ::get_column(&this->mirrorMatrixU_,source);
  pCVar1 = Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>
           ::get_column(&this->mirrorMatrixU_,target);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_false,_true>_>_>
  ::push_back(this_00,(Entry *)((long)((pCVar1->column_).super_type.data_.root_plus_size_.m_header.
                                       super_node.next_ + 0xffffffffffffffff) + 8));
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column_by(Index target, Index source)
{
  Column& curr = reducedMatrixR_.get_column(target);
  if constexpr (Master_matrix::Option_list::is_z2) {
    curr += reducedMatrixR_.get_column(source);
    // to avoid having to do line operations during vineyards, U is transposed
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.get_column(source).push_back(*mirrorMatrixU_.get_column(target).begin());
  } else {
    Column& toadd = reducedMatrixR_.get_column(source);
    Field_element coef = toadd.get_pivot_value();
    coef = operators_->get_inverse(coef);
    operators_->multiply_inplace(coef, operators_->get_characteristic() - curr.get_pivot_value());

    curr.multiply_source_and_add(toadd, coef);
    // but no transposition for Zp, careful if there will be vineyard or rep cycles in Zp one day
    // TODO: explain this somewhere in the documentation...
    mirrorMatrixU_.multiply_source_and_add_to(coef, source, target);
  }
}